

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_address_set_host(ENetAddress *address,char *name)

{
  int iVar1;
  int iVar2;
  addrinfo *paVar3;
  addrinfo *resultList;
  addrinfo *local_18;
  
  local_18 = (addrinfo *)0x0;
  iVar1 = getaddrinfo(name,(char *)0x0,(addrinfo *)0x0,&local_18);
  iVar2 = -1;
  paVar3 = local_18;
  if (iVar1 == 0) {
    for (; paVar3 != (addrinfo *)0x0; paVar3 = paVar3->ai_next) {
      if (((paVar3->ai_family == 2) && (paVar3->ai_addr != (sockaddr *)0x0)) &&
         (0xf < paVar3->ai_addrlen)) {
        address->host = *(enet_uint32 *)(paVar3->ai_addr->sa_data + 2);
        freeaddrinfo(local_18);
        return 0;
      }
    }
    if (local_18 != (addrinfo *)0x0) {
      freeaddrinfo(local_18);
    }
    iVar2 = inet_pton(2,name,address);
    iVar2 = -(uint)(iVar2 == 0);
  }
  return iVar2;
}

Assistant:

int
enet_address_set_host (ENetAddress * address, const char * name)
{
#ifdef HAS_GETADDRINFO
    struct addrinfo hints, * resultList = NULL, * result = NULL;

    memset (& hints, 0, sizeof (hints));
    hints.ai_family = AF_INET;

    if (getaddrinfo (name, NULL, NULL, & resultList) != 0)
      return -1;

    for (result = resultList; result != NULL; result = result -> ai_next)
    {
        if (result -> ai_family == AF_INET && result -> ai_addr != NULL && result -> ai_addrlen >= sizeof (struct sockaddr_in))
        {
            struct sockaddr_in * sin = (struct sockaddr_in *) result -> ai_addr;

            address -> host = sin -> sin_addr.s_addr;

            freeaddrinfo (resultList);

            return 0;
        }
    }

    if (resultList != NULL)
      freeaddrinfo (resultList);
#else
    struct hostent * hostEntry = NULL;
#ifdef HAS_GETHOSTBYNAME_R
    struct hostent hostData;
    char buffer [2048];
    int errnum;

#if defined(linux) || defined(__linux) || defined(__linux__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__DragonFly__) || defined(__GNU__)
    gethostbyname_r (name, & hostData, buffer, sizeof (buffer), & hostEntry, & errnum);
#else
    hostEntry = gethostbyname_r (name, & hostData, buffer, sizeof (buffer), & errnum);
#endif
#else
    hostEntry = gethostbyname (name);
#endif

    if (hostEntry != NULL && hostEntry -> h_addrtype == AF_INET)
    {
        address -> host = * (enet_uint32 *) hostEntry -> h_addr_list [0];

        return 0;
    }
#endif

    return enet_address_set_host_ip (address, name);
}